

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void key_press_proc(Am_Object *command)

{
  long lVar1;
  char cVar2;
  short *psVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  undefined8 uVar6;
  bool bVar7;
  Am_Input_Char c;
  Am_Object animator;
  Am_Object inter;
  short local_2c;
  ushort local_2a;
  Am_Object local_28 [8];
  Am_Object local_20 [8];
  Am_Object local_18 [8];
  Am_Input_Char local_10;
  Am_Input_Char local_c;
  
  Am_Object::Get_Object((ushort)local_18,(ulong)command);
  psVar3 = (short *)Am_Object::Get((ushort)local_18,0x11b);
  lVar1 = *(long *)(psVar3 + 4);
  if ((lVar1 != 0) && (*psVar3 != (short)Am_Input_Char::Am_Input_Char_ID)) {
    uVar6 = Am_Error();
    Am_Object::~Am_Object(local_18);
    _Unwind_Resume(uVar6);
  }
  local_2c = (short)lVar1;
  local_2a = (ushort)((ulong)lVar1 >> 0x10) & 0xfff;
  Am_Input_Char::Am_Input_Char(&local_c,"q",true);
  bVar7 = ((uint)local_c & 0xffff) != 0x103;
  if (!(bool)((bVar7 && local_2c == 0x103) | ~(bVar7 || local_2c == 0x103) & 1U)) {
    cVar2 = Am_Input_Char::helper_check_equal(SUB84(&local_2c,0));
    if (cVar2 != '\0') {
      Am_Exit_Main_Event_Loop();
      goto LAB_001048b0;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_10,"a",true);
  bVar7 = ((uint)local_10 & 0xffff) != 0x103;
  if (!(bool)((bVar7 && local_2c == 0x103) | ~(bVar7 || local_2c == 0x103) & 1U)) {
    cVar2 = Am_Input_Char::helper_check_equal(SUB84(&local_2c,0));
    if (cVar2 != '\0') {
      Am_Object::Get_Object((ushort)local_20,(ulong)local_18);
      pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_20,(ulong)ANIMATOR);
      Am_Object::Am_Object(local_28,pAVar4);
      Am_Object::~Am_Object(local_20);
      pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_28,0xcc);
      bVar7 = Am_Value::operator_cast_to_bool(pAVar4);
      Am_Object::Set((ushort)local_28,true,(ulong)!bVar7);
      Am_Object::~Am_Object(local_28);
      goto LAB_001048b0;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Keyboard Commands:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  a - toggle animation",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  q - quit",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
LAB_001048b0:
  Am_Object::~Am_Object(local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, key_press, (Am_Object command))
{
  Am_Object inter = command.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q")
    Am_Exit_Main_Event_Loop();
  else if (c == "a") {
    Am_Object animator = inter.Get_Owner().Get(ANIMATOR);
    bool active = animator.Get(Am_ACTIVE);
    animator.Set(Am_ACTIVE, !active);
  } else
    cout << "Keyboard Commands:" << endl
         << "  a - toggle animation" << endl
         << "  q - quit" << endl;
}